

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::ValidateConfig
                  (Error *__return_storage_ptr__,Config *aConfig)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  Error *aError;
  v10 *this;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  undefined1 local_b50 [15];
  v10 local_b41;
  v10 *local_b40;
  char *local_b38;
  string local_b30;
  Error local_b10;
  anon_class_1_0_00000001 local_ae2;
  v10 local_ae1;
  v10 *local_ae0;
  size_t local_ad8;
  string local_ad0;
  Error local_ab0;
  anon_class_1_0_00000001 local_a82;
  v10 local_a81;
  v10 *local_a80;
  size_t local_a78;
  string local_a70;
  Error local_a50;
  anon_class_1_0_00000001 local_a22;
  v10 local_a21;
  v10 *local_a20;
  size_t local_a18;
  string local_a10;
  Error local_9f0;
  anon_class_1_0_00000001 local_9c2;
  v10 local_9c1;
  v10 *local_9c0;
  size_t local_9b8;
  string local_9b0;
  Error local_990;
  undefined1 local_968 [15];
  v10 local_959;
  v10 *local_958;
  char *local_950;
  string local_948;
  Error local_928;
  anon_class_1_0_00000001 local_8fa;
  v10 local_8f9;
  v10 *local_8f8;
  size_t local_8f0;
  string local_8e8;
  Error local_8c8;
  undefined1 local_8a0 [8];
  Tlv domainNameTlv;
  v10 *local_878;
  char *local_870;
  string local_868;
  Error local_848;
  int local_820;
  anon_class_1_0_00000001 local_81a;
  v10 local_819;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_818;
  char *local_810;
  string local_808;
  Error local_7e8;
  anon_class_1_0_00000001 local_7ba;
  v10 local_7b9;
  v10 *local_7b8;
  size_t local_7b0;
  string local_7a8;
  Error local_788;
  undefined1 local_750 [8];
  Tlv commissionerIdTlv;
  Config *aConfig_local;
  Error *error;
  undefined1 local_700 [16];
  v10 *local_6f0;
  ulong local_6e8;
  v10 *local_6e0;
  size_t sStack_6d8;
  string *local_6d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6c8 [3];
  undefined1 local_6b0 [16];
  v10 *local_6a0;
  ulong local_698;
  v10 *local_690;
  size_t sStack_688;
  string *local_680;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_678 [3];
  undefined1 local_660 [16];
  v10 *local_650;
  ulong local_648;
  v10 *local_640;
  size_t sStack_638;
  string *local_630;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_628 [3];
  undefined1 local_610 [16];
  v10 *local_600;
  ulong local_5f8;
  v10 *local_5f0;
  size_t sStack_5e8;
  string *local_5e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5d8 [3];
  undefined1 local_5c0 [16];
  v10 *local_5b0;
  ulong local_5a8;
  v10 *local_5a0;
  size_t sStack_598;
  string *local_590;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_588 [3];
  undefined1 local_570 [16];
  v10 *local_560;
  ulong local_558;
  v10 *local_550;
  size_t sStack_548;
  string *local_540;
  v10 *local_538;
  v10 **local_530;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_528 [2];
  undefined1 local_518 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  char *local_500;
  string *local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  char *pcStack_4e8;
  string *local_4e0;
  v10 *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_4d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  local_4c8;
  undefined1 local_498 [16];
  v10 *local_488;
  char *local_480;
  undefined4 *local_478;
  undefined4 *local_470;
  uint32_t *local_468;
  v10 *local_460;
  char *pcStack_458;
  string *local_450;
  v10 *local_448;
  v10 **local_440;
  v10 *local_438;
  v10 **local_430;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_428 [2];
  undefined1 local_418 [16];
  v10 *local_408;
  char *local_400;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_3f8;
  v10 *local_3f0;
  char *pcStack_3e8;
  string *local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_3d8 [3];
  undefined1 local_3c0 [16];
  v10 *local_3b0;
  char *local_3a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  *local_3a0;
  v10 *local_398;
  char *pcStack_390;
  string *local_388;
  v10 *local_380;
  v10 **local_378;
  v10 *local_370;
  v10 **local_368;
  v10 *local_360;
  v10 **local_358;
  v10 *local_350;
  v10 **local_348;
  v10 *local_340;
  v10 **local_338;
  v10 *local_330;
  v10 **local_328;
  v10 **local_320;
  v10 *local_318;
  size_t sStack_310;
  v10 **local_300;
  v10 *local_2f8;
  size_t sStack_2f0;
  v10 **local_2e0;
  v10 *local_2d8;
  size_t sStack_2d0;
  v10 **local_2c0;
  v10 *local_2b8;
  size_t sStack_2b0;
  v10 **local_2a0;
  v10 *local_298;
  size_t sStack_290;
  v10 **local_280;
  v10 *local_278;
  size_t sStack_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_260;
  undefined1 *local_258;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_250;
  undefined8 local_248;
  undefined1 *local_240;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_238;
  undefined1 *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_228;
  undefined8 local_220;
  undefined1 *local_218;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_210;
  undefined1 *local_208;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_200;
  undefined8 local_1f8;
  undefined1 *local_1f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e8;
  undefined1 *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c0;
  undefined1 *local_1b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  Error **local_198;
  undefined1 *local_190;
  Error **local_188;
  undefined8 local_180;
  undefined1 *local_178;
  Error **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  undefined1 *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_110;
  undefined8 local_108;
  undefined1 *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
  **local_10;
  
  commissionerIdTlv.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  aError = (Error *)0xa;
  tlv::Tlv::Tlv((Tlv *)local_750,kCommissionerId,&aConfig->mId,kMeshCoP);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = tlv::Tlv::IsValid((Tlv *)local_750);
    if (bVar1) {
      local_820 = 0;
    }
    else {
      ValidateConfig::anon_class_1_0_00000001::operator()(&local_81a);
      local_4d0 = &local_818;
      local_4d8 = &local_819;
      bVar4 = ::fmt::v10::operator()(local_4d8);
      local_810 = (char *)bVar4.size_;
      local_818 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                ();
      local_4f8 = &aConfig->mId;
      local_4e0 = &local_808;
      local_4f0 = local_818;
      pcStack_4e8 = local_810;
      local_140 = &local_4f0;
      local_508 = local_818;
      local_500 = local_810;
      local_138 = local_508;
      pcStack_130 = local_500;
      local_528[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_4f8,(v10 *)local_4e0,local_818);
      local_118 = local_518;
      in_R8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **)
              local_528;
      local_108 = 0xd;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = local_500;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)in_R8;
      local_120 = in_R8;
      local_110 = in_R8;
      local_100 = local_118;
      local_f8 = in_R8;
      ::fmt::v10::vformat_abi_cxx11_(&local_808,(v10 *)local_508,fmt_00,args_00);
      Error::Error(&local_7e8,kInvalidArgs,&local_808);
      aError = &local_7e8;
      Error::operator=(__return_storage_ptr__,aError);
      Error::~Error(&local_7e8);
      std::__cxx11::string::~string((string *)&local_808);
      local_820 = 4;
    }
  }
  else {
    ValidateConfig::anon_class_1_0_00000001::operator()(&local_7ba);
    local_530 = &local_7b8;
    local_538 = &local_7b9;
    bVar4 = ::fmt::v10::operator()(local_538);
    local_7b0 = bVar4.size_;
    local_7b8 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_540 = &local_7a8;
    local_550 = local_7b8;
    sStack_548 = local_7b0;
    local_320 = &local_550;
    local_560 = local_7b8;
    local_558 = local_7b0;
    local_318 = local_560;
    sStack_310 = local_558;
    local_588[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_258 = local_570;
    in_R8 = local_588;
    local_248 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_558;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)in_R8;
    local_260 = in_R8;
    local_250 = in_R8;
    local_240 = local_258;
    local_148 = in_R8;
    ::fmt::v10::vformat_abi_cxx11_(&local_7a8,local_560,fmt,args);
    Error::Error(&local_788,kInvalidArgs,&local_7a8);
    aError = &local_788;
    Error::operator=(__return_storage_ptr__,aError);
    Error::~Error(&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    local_820 = 4;
  }
  tlv::Tlv::~Tlv((Tlv *)local_750);
  if (local_820 == 0) {
    if ((aConfig->mKeepAliveInterval < 0x1e) || (0x2d < aConfig->mKeepAliveInterval)) {
      ValidateConfig::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 ((long)&domainNameTlv.mValue.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
      local_440 = &local_878;
      local_448 = (v10 *)((long)&domainNameTlv.mValue.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      bVar4 = ::fmt::v10::operator()(local_448);
      local_870 = (char *)bVar4.size_;
      local_878 = (v10 *)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_unsigned_int_&,_const_unsigned_int_&,_const_unsigned_int_&,_FMT_COMPILE_STRING,_0>
                ();
      local_468 = &aConfig->mKeepAliveInterval;
      local_450 = &local_868;
      local_460 = local_878;
      pcStack_458 = local_870;
      local_470 = &kMinKeepAliveInterval;
      local_478 = &kMaxKeepAliveInterval;
      local_f0 = &local_460;
      local_488 = local_878;
      local_480 = local_870;
      local_e8 = local_488;
      pcStack_e0 = local_480;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const,unsigned_int_const,unsigned_int_const>
                (&local_4c8,(v10 *)local_468,&kMinKeepAliveInterval,&kMaxKeepAliveInterval,
                 (uint *)in_R8);
      local_c8 = local_498;
      local_d0 = &local_4c8;
      local_b0 = 0x222;
      fmt_01.size_ = 0x222;
      fmt_01.data_ = local_480;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_d0;
      local_c0 = local_d0;
      local_b8 = local_d0;
      local_a8 = local_c8;
      ::fmt::v10::vformat_abi_cxx11_(&local_868,local_488,fmt_01,args_01);
      Error::Error(&local_848,kInvalidArgs,&local_868);
      Error::operator=(__return_storage_ptr__,&local_848);
      Error::~Error(&local_848);
      std::__cxx11::string::~string((string *)&local_868);
    }
    else if ((aConfig->mEnableCcm & 1U) == 0) {
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&aConfig->mPSKc);
      if (bVar1) {
        ValidateConfig::anon_class_1_0_00000001::operator()(&local_ae2);
        local_338 = &local_ae0;
        local_340 = &local_ae1;
        bVar4 = ::fmt::v10::operator()(local_340);
        local_ad8 = bVar4.size_;
        local_ae0 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_6d0 = &local_ad0;
        local_6e0 = local_ae0;
        sStack_6d8 = local_ad8;
        local_280 = &local_6e0;
        local_6f0 = local_ae0;
        local_6e8 = local_ad8;
        local_278 = local_6f0;
        sStack_270 = local_6e8;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_190 = local_700;
        local_198 = &error;
        local_180 = 0;
        fmt_07.size_ = 0;
        fmt_07.data_ = (char *)local_6e8;
        args_07.field_1.values_ = in_R9.values_;
        args_07.desc_ = (unsigned_long_long)local_198;
        local_188 = local_198;
        local_178 = local_190;
        local_170 = local_198;
        ::fmt::v10::vformat_abi_cxx11_(&local_ad0,local_6f0,fmt_07,args_07);
        Error::Error(&local_ab0,kInvalidArgs,&local_ad0);
        Error::operator=(__return_storage_ptr__,&local_ab0);
        Error::~Error(&local_ab0);
        std::__cxx11::string::~string((string *)&local_ad0);
      }
      else {
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&aConfig->mPSKc);
        if (0x10 < sVar3) {
          ValidateConfig::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)(local_b50 + 0xe));
          local_328 = &local_b40;
          local_330 = &local_b41;
          bVar4 = ::fmt::v10::operator()(local_330);
          local_b38 = (char *)bVar4.size_;
          local_b40 = (v10 *)bVar4.data_;
          ::fmt::v10::detail::check_format_string<unsigned_long,_FMT_COMPILE_STRING,_0>();
          local_b50._0_8_ =
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&aConfig->mPSKc);
          local_3e0 = &local_b30;
          local_3f0 = local_b40;
          pcStack_3e8 = local_b38;
          local_3f8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
                       *)local_b50;
          local_80 = &local_3f0;
          local_408 = local_b40;
          local_400 = local_b38;
          local_78 = local_408;
          pcStack_70 = local_400;
          local_428[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long>
                                   (local_3f8,(v10 *)aError,(unsigned_long *)local_3e0);
          local_30 = local_418;
          local_38 = local_428;
          local_20 = 4;
          fmt_08.size_ = 4;
          fmt_08.data_ = local_400;
          args_08.field_1.values_ = in_R9.values_;
          args_08.desc_ = (unsigned_long_long)local_38;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          ::fmt::v10::vformat_abi_cxx11_(&local_b30,local_408,fmt_08,args_08);
          Error::Error(&local_b10,kInvalidArgs,&local_b30);
          Error::operator=(__return_storage_ptr__,&local_b10);
          Error::~Error(&local_b10);
          std::__cxx11::string::~string((string *)&local_b30);
        }
      }
    }
    else {
      this = (v10 *)0x3b;
      tlv::Tlv::Tlv((Tlv *)local_8a0,kDomainName,&aConfig->mDomainName,kMeshCoP);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        bVar1 = tlv::Tlv::IsValid((Tlv *)local_8a0);
        if (bVar1) {
          bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                            (&aConfig->mPrivateKey);
          if (bVar1) {
            ValidateConfig::anon_class_1_0_00000001::operator()(&local_9c2);
            local_368 = &local_9c0;
            local_370 = &local_9c1;
            bVar4 = ::fmt::v10::operator()(local_370);
            local_9b8 = bVar4.size_;
            local_9c0 = (v10 *)bVar4.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_5e0 = &local_9b0;
            local_5f0 = local_9c0;
            sStack_5e8 = local_9b8;
            local_2e0 = &local_5f0;
            local_600 = local_9c0;
            local_5f8 = local_9b8;
            local_2d8 = local_600;
            sStack_2d0 = local_5f8;
            local_628[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_208 = local_610;
            local_210 = local_628;
            local_1f8 = 0;
            fmt_04.size_ = 0;
            fmt_04.data_ = (char *)local_5f8;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)local_210;
            local_200 = local_210;
            local_1f0 = local_208;
            local_158 = local_210;
            ::fmt::v10::vformat_abi_cxx11_(&local_9b0,local_600,fmt_04,args_04);
            Error::Error(&local_990,kInvalidArgs,&local_9b0);
            Error::operator=(__return_storage_ptr__,&local_990);
            Error::~Error(&local_990);
            std::__cxx11::string::~string((string *)&local_9b0);
            local_820 = 4;
          }
          else {
            bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                              (&aConfig->mCertificate);
            if (bVar1) {
              ValidateConfig::anon_class_1_0_00000001::operator()(&local_a22);
              local_358 = &local_a20;
              local_360 = &local_a21;
              bVar4 = ::fmt::v10::operator()(local_360);
              local_a18 = bVar4.size_;
              local_a20 = (v10 *)bVar4.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_630 = &local_a10;
              local_640 = local_a20;
              sStack_638 = local_a18;
              local_2c0 = &local_640;
              local_650 = local_a20;
              local_648 = local_a18;
              local_2b8 = local_650;
              sStack_2b0 = local_648;
              local_678[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_1e0 = local_660;
              local_1e8 = local_678;
              local_1d0 = 0;
              fmt_05.size_ = 0;
              fmt_05.data_ = (char *)local_648;
              args_05.field_1.values_ = in_R9.values_;
              args_05.desc_ = (unsigned_long_long)local_1e8;
              local_1d8 = local_1e8;
              local_1c8 = local_1e0;
              local_160 = local_1e8;
              ::fmt::v10::vformat_abi_cxx11_(&local_a10,local_650,fmt_05,args_05);
              Error::Error(&local_9f0,kInvalidArgs,&local_a10);
              Error::operator=(__return_storage_ptr__,&local_9f0);
              Error::~Error(&local_9f0);
              std::__cxx11::string::~string((string *)&local_a10);
              local_820 = 4;
            }
            else {
              bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                                (&aConfig->mTrustAnchor);
              if (bVar1) {
                ValidateConfig::anon_class_1_0_00000001::operator()(&local_a82);
                local_348 = &local_a80;
                local_350 = &local_a81;
                bVar4 = ::fmt::v10::operator()(local_350);
                local_a78 = bVar4.size_;
                local_a80 = (v10 *)bVar4.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_680 = &local_a70;
                local_690 = local_a80;
                sStack_688 = local_a78;
                local_2a0 = &local_690;
                local_6a0 = local_a80;
                local_698 = local_a78;
                local_298 = local_6a0;
                sStack_290 = local_698;
                local_6c8[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_1b8 = local_6b0;
                local_1c0 = local_6c8;
                local_1a8 = 0;
                fmt_06.size_ = 0;
                fmt_06.data_ = (char *)local_698;
                args_06.field_1.values_ = in_R9.values_;
                args_06.desc_ = (unsigned_long_long)local_1c0;
                local_1b0 = local_1c0;
                local_1a0 = local_1b8;
                local_168 = local_1c0;
                ::fmt::v10::vformat_abi_cxx11_(&local_a70,local_6a0,fmt_06,args_06);
                Error::Error(&local_a50,kInvalidArgs,&local_a70);
                Error::operator=(__return_storage_ptr__,&local_a50);
                Error::~Error(&local_a50);
                std::__cxx11::string::~string((string *)&local_a70);
                local_820 = 4;
              }
              else {
                local_820 = 0;
              }
            }
          }
        }
        else {
          ValidateConfig::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)(local_968 + 0xe));
          local_378 = &local_958;
          local_380 = &local_959;
          bVar4 = ::fmt::v10::operator()(local_380);
          local_950 = (char *)bVar4.size_;
          local_958 = (v10 *)bVar4.data_;
          ::fmt::v10::detail::check_format_string<unsigned_long,_FMT_COMPILE_STRING,_0>();
          local_968._0_8_ = std::__cxx11::string::size();
          local_388 = &local_948;
          local_398 = local_958;
          pcStack_390 = local_950;
          local_3a0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long>
                       *)local_968;
          local_a0 = &local_398;
          local_3b0 = local_958;
          local_3a8 = local_950;
          local_98 = local_3b0;
          pcStack_90 = local_3a8;
          local_3d8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long>
                                   (local_3a0,this,(unsigned_long *)local_388);
          local_60 = local_3c0;
          local_68 = local_3d8;
          local_50 = 4;
          fmt_03.size_ = 4;
          fmt_03.data_ = local_3a8;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)local_68;
          local_58 = local_68;
          local_48 = local_60;
          local_40 = local_68;
          ::fmt::v10::vformat_abi_cxx11_(&local_948,local_3b0,fmt_03,args_03);
          Error::Error(&local_928,kInvalidArgs,&local_948);
          Error::operator=(__return_storage_ptr__,&local_928);
          Error::~Error(&local_928);
          std::__cxx11::string::~string((string *)&local_948);
          local_820 = 4;
        }
      }
      else {
        ValidateConfig::anon_class_1_0_00000001::operator()(&local_8fa);
        local_430 = &local_8f8;
        local_438 = &local_8f9;
        bVar4 = ::fmt::v10::operator()(local_438);
        local_8f0 = bVar4.size_;
        local_8f8 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_590 = &local_8e8;
        local_5a0 = local_8f8;
        sStack_598 = local_8f0;
        local_300 = &local_5a0;
        local_5b0 = local_8f8;
        local_5a8 = local_8f0;
        local_2f8 = local_5b0;
        sStack_2f0 = local_5a8;
        local_5d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_230 = local_5c0;
        local_238 = local_5d8;
        local_220 = 0;
        fmt_02.size_ = 0;
        fmt_02.data_ = (char *)local_5a8;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)local_238;
        local_228 = local_238;
        local_218 = local_230;
        local_150 = local_238;
        ::fmt::v10::vformat_abi_cxx11_(&local_8e8,local_5b0,fmt_02,args_02);
        Error::Error(&local_8c8,kInvalidArgs,&local_8e8);
        Error::operator=(__return_storage_ptr__,&local_8c8);
        Error::~Error(&local_8c8);
        std::__cxx11::string::~string((string *)&local_8e8);
        local_820 = 4;
      }
      tlv::Tlv::~Tlv((Tlv *)local_8a0);
      if (local_820 != 0) goto joined_r0x00263205;
    }
  }
  else {
joined_r0x00263205:
    if (local_820 != 4) goto LAB_0026367c;
  }
  commissionerIdTlv.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  local_820 = 1;
LAB_0026367c:
  if ((commissionerIdTlv.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::ValidateConfig(const Config &aConfig)
{
    Error error;

    {
        tlv::Tlv commissionerIdTlv{tlv::Type::kCommissionerId, aConfig.mId};
        VerifyOrExit(!aConfig.mId.empty(), error = ERROR_INVALID_ARGS("commissioner ID is mandatory"));
        VerifyOrExit(commissionerIdTlv.IsValid(),
                     error = ERROR_INVALID_ARGS("{} is not a valid Commissioner ID", aConfig.mId));
    }

    VerifyOrExit(
        (aConfig.mKeepAliveInterval >= kMinKeepAliveInterval && aConfig.mKeepAliveInterval <= kMaxKeepAliveInterval),
        error = ERROR_INVALID_ARGS("keep-alive internal {} exceeds range [{}, {}]", aConfig.mKeepAliveInterval,
                                   kMinKeepAliveInterval, kMaxKeepAliveInterval));

    if (aConfig.mEnableCcm)
    {
        tlv::Tlv domainNameTlv{tlv::Type::kDomainName, aConfig.mDomainName};

#if !OT_COMM_CONFIG_CCM_ENABLE
        ExitNow(error = ERROR_INVALID_ARGS(CCM_NOT_IMPLEMENTED));
#endif

        VerifyOrExit(!aConfig.mDomainName.empty(), error = ERROR_INVALID_ARGS("missing Domain Name for CCM network"));
        VerifyOrExit(domainNameTlv.IsValid(),
                     error = ERROR_INVALID_ARGS("Domain Name is too long (length={})", aConfig.mDomainName.size()));
        VerifyOrExit(!aConfig.mPrivateKey.empty(),
                     error = ERROR_INVALID_ARGS("missing Private Key file for CCM network"));
        VerifyOrExit(!aConfig.mCertificate.empty(),
                     error = ERROR_INVALID_ARGS("missing Certificate file for CCM network"));
        VerifyOrExit(!aConfig.mTrustAnchor.empty(),
                     error = ERROR_INVALID_ARGS("missing Trust Anchor file for CCM network"));
    }
    else
    {
        // Should we also enable setting PSKc from passphrase?
        VerifyOrExit(!aConfig.mPSKc.empty(), error = ERROR_INVALID_ARGS("missing PSKc for non-CCM network"));
        VerifyOrExit(aConfig.mPSKc.size() <= kMaxPSKcLength,
                     error = ERROR_INVALID_ARGS("PSKc is too long (length={})", aConfig.mPSKc.size()));
    }

exit:
    return error;
}